

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Reshape_x86::forward
          (Reshape_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Mat *dst;
  int *piVar4;
  void *pvVar5;
  Allocator *pAVar6;
  size_t sVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  int iVar24;
  uint uVar25;
  undefined4 *puVar26;
  undefined4 *puVar27;
  long lVar28;
  Mat *src;
  int iVar29;
  uint uVar30;
  long lVar31;
  uint uVar32;
  long lVar33;
  undefined4 *puVar34;
  uint uVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  ulong uVar40;
  size_t sVar41;
  long lVar42;
  byte bVar43;
  bool bVar44;
  int outh;
  int outw;
  int outc;
  int outd;
  int local_124;
  ulong local_120;
  Mat *local_118;
  uint local_10c;
  ulong local_108;
  ulong local_100;
  Mat local_f8;
  long local_a8;
  size_t local_a0;
  uint local_94;
  Mat *local_90;
  uint local_84;
  Option *local_80;
  Option opt_flatten;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  dst = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  outw = (this->super_Reshape).w;
  outh = (this->super_Reshape).h;
  outd = (this->super_Reshape).d;
  outc = (this->super_Reshape).c;
  if (((this->super_Reshape).shape_expr._M_string_length != 0) &&
     (iVar24 = Reshape::eval_shape_expr(&this->super_Reshape,bottom_blobs,&outw,&outh,&outd,&outc),
     iVar24 != 0)) {
    return -1;
  }
  iVar24 = (this->super_Reshape).ndim;
  if (iVar24 == 1) {
    flatten(src,dst,opt);
    if (dst->data == (void *)0x0) {
      return -100;
    }
    if ((long)dst->c * dst->cstep != 0) {
      return 0;
    }
    return -100;
  }
  uVar25 = src->dims;
  iVar39 = src->elempack;
  uVar36 = (ulong)iVar39;
  uVar40 = src->elemsize;
  iVar29 = src->w * iVar39 * src->h * src->d * src->c;
  uVar32 = 0xffffffff;
  if (iVar24 == 2) {
    if (outw == 0) {
      iVar24 = 1;
      if (uVar25 == 1) {
        iVar24 = iVar39;
      }
      outw = src->w * iVar24;
    }
    if (outh == 0) {
      iVar24 = 1;
      if (uVar25 == 2) {
        iVar24 = iVar39;
      }
      outh = iVar24 * src->h;
    }
    if (outw == -1) {
      outw = iVar29 / outh;
    }
    if (outh == -1) {
      outh = iVar29 / outw;
    }
    bVar43 = (outh & 3U) == 0 & opt->use_packing_layout;
    iVar24 = (uint)bVar43 + (uint)bVar43 * 2 + 1;
    sVar41 = uVar40 / uVar36 << bVar43 * '\x02';
    local_124 = iVar29;
    local_118 = src;
    if (((uVar25 == 2) && (src->h * iVar39 == outh)) && (iVar39 == iVar24)) {
      if (dst != src) {
        piVar4 = src->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = dst->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (dst->allocator == (Allocator *)0x0) {
              if (dst->data != (void *)0x0) {
                local_120 = uVar40;
                free(dst->data);
                uVar40 = local_120;
              }
            }
            else {
              local_120 = uVar40;
              (*dst->allocator->_vptr_Allocator[3])();
              uVar40 = local_120;
            }
          }
        }
        dst->cstep = 0;
        dst->data = (void *)0x0;
        dst->refcount = (int *)0x0;
        *(undefined8 *)((long)&dst->refcount + 4) = 0;
        *(undefined8 *)((long)&dst->elemsize + 4) = 0;
        dst->dims = 0;
        dst->w = 0;
        dst->h = 0;
        dst->d = 0;
        dst->c = 0;
        piVar4 = src->refcount;
        dst->data = src->data;
        dst->refcount = piVar4;
        dst->elemsize = src->elemsize;
        dst->elempack = src->elempack;
        dst->allocator = src->allocator;
        iVar24 = src->w;
        iVar39 = src->h;
        iVar29 = src->d;
        dst->dims = src->dims;
        dst->w = iVar24;
        dst->h = iVar39;
        dst->d = iVar29;
        dst->c = src->c;
        dst->cstep = src->cstep;
      }
      bVar44 = false;
      uVar32 = 0;
    }
    else if (bVar43 == 0) {
      local_120 = uVar40;
      local_a0 = sVar41;
      flatten(src,dst,opt);
      uVar32 = 0xffffff9c;
      uVar40 = local_120;
      if (dst->data == (void *)0x0) {
        bVar44 = false;
      }
      else {
        bVar44 = false;
        if ((long)dst->c * dst->cstep != 0) {
          dst->dims = 2;
          dst->w = outw;
          dst->h = outh;
          dst->cstep = (long)outh * (long)outw;
          dst->elemsize = local_a0;
          dst->elempack = 1;
          uVar32 = 0;
        }
      }
    }
    else {
      local_f8.data = src->data;
      piVar4 = src->refcount;
      local_f8.refcount._0_4_ = SUB84(piVar4,0);
      local_f8.refcount._4_4_ = (undefined4)((ulong)piVar4 >> 0x20);
      local_f8.elemsize._0_4_ = (undefined4)src->elemsize;
      local_f8.elemsize._4_4_ = (undefined4)(src->elemsize >> 0x20);
      local_f8.elempack = src->elempack;
      local_f8.allocator = src->allocator;
      local_f8.dims = src->dims;
      local_f8.w = src->w;
      local_f8.h = src->h;
      local_f8.d = src->d;
      local_f8.c = src->c;
      local_f8.cstep = src->cstep;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      opt_flatten.lightmode = opt->lightmode;
      opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
      opt_flatten.use_subgroup_ops = opt->use_subgroup_ops;
      opt_flatten.use_reserved_0 = opt->use_reserved_0;
      opt_flatten.num_threads = opt->num_threads;
      opt_flatten.workspace_allocator = opt->workspace_allocator;
      opt_flatten.openmp_blocktime = opt->openmp_blocktime;
      opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
      opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_flatten.use_int8_inference = opt->use_int8_inference;
      opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
      opt_flatten.use_bf16_storage = opt->use_bf16_storage;
      opt_flatten.use_fp16_packed = opt->use_fp16_packed;
      opt_flatten.use_fp16_storage = opt->use_fp16_storage;
      opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_flatten.use_int8_packed = opt->use_int8_packed;
      opt_flatten.use_int8_storage = opt->use_int8_storage;
      opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_flatten.use_packing_layout = opt->use_packing_layout;
      opt_flatten.vulkan_device_index = opt->vulkan_device_index;
      opt_flatten.use_reserved_1 = opt->use_reserved_1;
      opt_flatten.use_image_storage = opt->use_image_storage;
      opt_flatten.use_tensor_storage = opt->use_tensor_storage;
      opt_flatten.use_reserved_2 = opt->use_reserved_2;
      opt_flatten.flush_denormals = opt->flush_denormals;
      opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
      opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_flatten.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      opt_flatten.use_fp16_uniform = opt->use_fp16_uniform;
      opt_flatten.use_int8_uniform = opt->use_int8_uniform;
      opt_flatten.use_reserved_9 = opt->use_reserved_9;
      opt_flatten.use_reserved_10 = opt->use_reserved_10;
      opt_flatten.use_reserved_11 = opt->use_reserved_11;
      opt_flatten.blob_allocator = opt->workspace_allocator;
      local_120 = uVar40;
      local_108 = (ulong)uVar25;
      local_100 = uVar36;
      flatten(src,&local_f8,&opt_flatten);
      bVar44 = (long)local_f8.c * local_f8.cstep == 0;
      uVar25 = (uint)local_108;
      uVar32 = (local_f8.data == (void *)0x0 || bVar44) - 1 | 0xffffff9c;
      if (local_f8.data == (void *)0x0 || bVar44) {
        bVar44 = false;
      }
      else {
        local_94 = uVar32;
        Mat::create(dst,outw,outh / iVar24,sVar41,iVar24,opt->blob_allocator);
        uVar25 = (uint)local_108;
        if (dst->data == (void *)0x0) {
          bVar44 = false;
          uVar32 = 0xffffff9c;
        }
        else {
          bVar44 = (long)dst->c * dst->cstep != 0;
          uVar32 = 0xffffff9c;
          if (bVar44) {
            uVar32 = local_94;
          }
          if (((bVar43 & bVar44) == 1) && (bVar44 = true, uVar32 = local_94, 0 < dst->h)) {
            lVar33 = (long)outw;
            local_10c = outw * 4;
            local_84 = outw & 0xfffffffc;
            local_a8 = lVar33 * 0x10;
            lVar31 = lVar33 * 8;
            lVar38 = lVar33 * 0xc;
            iVar24 = 0;
            lVar42 = 0;
            sVar41 = lVar33 * 4;
            do {
              local_a0 = sVar41;
              iVar39 = dst->w;
              pvVar5 = dst->data;
              sVar41 = dst->elemsize;
              puVar26 = (undefined4 *)(lVar42 * iVar39 * sVar41 + (long)pvVar5);
              if (outw < 4) {
                lVar1 = (long)(int)(local_10c * (int)lVar42) * 4;
                lVar2 = (lVar42 * 4 + 1) * lVar33 * 4;
                lVar3 = (lVar42 * 4 + 2) * lVar33 * 4;
                lVar28 = (lVar42 * 4 + 3) * lVar33 * 4;
                uVar32 = 0;
              }
              else {
                iVar29 = 3;
                lVar28 = 0;
                do {
                  puVar27 = puVar26;
                  puVar34 = (undefined4 *)((long)local_f8.data + lVar28 + (long)iVar24 * 4);
                  uVar9 = puVar34[1];
                  uVar10 = puVar34[2];
                  uVar11 = puVar34[3];
                  puVar26 = (undefined4 *)((long)local_f8.data + lVar28 + local_a0);
                  uVar12 = *puVar26;
                  uVar13 = puVar26[1];
                  uVar14 = puVar26[2];
                  uVar15 = puVar26[3];
                  puVar26 = (undefined4 *)((long)local_f8.data + lVar28 + lVar31);
                  uVar16 = *puVar26;
                  uVar17 = puVar26[1];
                  uVar18 = puVar26[2];
                  uVar19 = puVar26[3];
                  puVar26 = (undefined4 *)((long)local_f8.data + lVar28 + lVar38);
                  uVar20 = *puVar26;
                  uVar21 = puVar26[1];
                  uVar22 = puVar26[2];
                  uVar23 = puVar26[3];
                  puVar26 = (undefined4 *)
                            ((long)pvVar5 + lVar28 * 4 + sVar41 * lVar42 * (long)iVar39 + 0x40);
                  puVar26[-0x10] = *puVar34;
                  puVar26[-0xf] = uVar12;
                  puVar26[-0xe] = uVar16;
                  puVar26[-0xd] = uVar20;
                  puVar26[-0xc] = uVar9;
                  puVar26[-0xb] = uVar13;
                  puVar26[-10] = uVar17;
                  puVar26[-9] = uVar21;
                  puVar26[-8] = uVar10;
                  puVar26[-7] = uVar14;
                  puVar26[-6] = uVar18;
                  puVar26[-5] = uVar22;
                  puVar26[-4] = uVar11;
                  puVar26[-3] = uVar15;
                  puVar26[-2] = uVar19;
                  puVar26[-1] = uVar23;
                  lVar28 = lVar28 + 0x10;
                  iVar29 = iVar29 + 4;
                } while (iVar29 < outw);
                puVar26 = puVar27 + 0x10;
                lVar1 = lVar28 + (long)iVar24 * 4;
                lVar2 = lVar28 + local_a0;
                lVar3 = lVar28 + lVar31;
                lVar28 = lVar28 + lVar38;
                uVar32 = local_84;
              }
              if ((int)uVar32 < outw) {
                lVar37 = 0;
                do {
                  *puVar26 = *(undefined4 *)((long)local_f8.data + lVar37 * 4 + lVar1);
                  puVar26[1] = *(undefined4 *)((long)local_f8.data + lVar37 * 4 + lVar2);
                  puVar26[2] = *(undefined4 *)((long)local_f8.data + lVar37 * 4 + lVar3);
                  puVar26[3] = *(undefined4 *)((long)local_f8.data + lVar37 * 4 + lVar28);
                  puVar26 = puVar26 + 4;
                  lVar37 = lVar37 + 1;
                } while (outw - uVar32 != (int)lVar37);
              }
              lVar42 = lVar42 + 1;
              iVar24 = iVar24 + local_10c;
              lVar31 = lVar31 + local_a8;
              lVar38 = lVar38 + local_a8;
              sVar41 = local_a0 + local_a8;
            } while (lVar42 < dst->h);
            bVar44 = true;
            local_90 = dst;
            local_80 = opt;
            uVar32 = local_94;
          }
        }
      }
      src = local_118;
      piVar4 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_f8.allocator == (Allocator *)0x0) {
            if (local_f8.data != (void *)0x0) {
              free(local_f8.data);
              uVar25 = (uint)local_108;
            }
          }
          else {
            (*(local_f8.allocator)->_vptr_Allocator[3])();
            uVar25 = (uint)local_108;
          }
        }
      }
      local_f8.cstep = 0;
      local_f8.data = (void *)0x0;
      local_f8.refcount._0_4_ = 0;
      local_f8.refcount._4_4_ = 0;
      local_f8.elemsize._0_4_ = 0;
      local_f8.elemsize._4_4_ = 0;
      local_f8.elempack = 0;
      local_f8.dims = 0;
      local_f8.w = 0;
      local_f8.h = 0;
      local_f8.d = 0;
      local_f8.c = 0;
      uVar36 = local_100;
      uVar40 = local_120;
    }
    iVar29 = local_124;
    if (!bVar44) {
      return uVar32;
    }
  }
  iVar24 = (this->super_Reshape).ndim;
  if (1 < iVar24 - 3U) {
    return 0;
  }
  uVar35 = (uint)uVar36;
  if (iVar24 == 3) {
    if (outw == 0) {
      uVar30 = 1;
      if (uVar25 == 1) {
        uVar30 = uVar35;
      }
      outw = uVar30 * src->w;
    }
    if (outh == 0) {
      uVar30 = 1;
      if (uVar25 == 2) {
        uVar30 = uVar35;
      }
      outh = uVar30 * src->h;
    }
    if (outc == 0) {
      uVar30 = 1;
      if (uVar25 == 3) {
        uVar30 = uVar35;
      }
      outc = uVar30 * src->c;
    }
    if (outw == -1) {
      outw = (int)((long)((ulong)(uint)((int)((long)iVar29 / (long)outc) >> 0x1f) << 0x20 |
                         (long)iVar29 / (long)outc & 0xffffffffU) / (long)outh);
    }
    if (outh == -1) {
      outh = (int)((long)((ulong)(uint)((int)((long)iVar29 / (long)outc) >> 0x1f) << 0x20 |
                         (long)iVar29 / (long)outc & 0xffffffffU) / (long)outw);
    }
    if (outc == -1) {
      outc = (int)((long)((ulong)(uint)((int)((long)iVar29 / (long)outh) >> 0x1f) << 0x20 |
                         (long)iVar29 / (long)outh & 0xffffffffU) / (long)outw);
    }
    outd = 1;
  }
  else {
    if (outw == 0) {
      uVar30 = 1;
      if (uVar25 == 1) {
        uVar30 = uVar35;
      }
      outw = uVar30 * src->w;
    }
    if (outh == 0) {
      uVar30 = 1;
      if (uVar25 == 2) {
        uVar30 = uVar35;
      }
      outh = uVar30 * src->h;
    }
    if (outd == 0) {
      outd = src->d;
    }
    if (outc == 0) {
      uVar30 = 1;
      if (uVar25 - 3 < 2) {
        uVar30 = uVar35;
      }
      outc = uVar30 * src->c;
    }
    if (outw == -1) {
      uVar8 = (long)((ulong)(uint)((int)((long)iVar29 / (long)outc) >> 0x1f) << 0x20 |
                    (long)iVar29 / (long)outc & 0xffffffffU) / (long)outd;
      outw = (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                  (long)outh);
    }
    if (outh == -1) {
      uVar8 = (long)((ulong)(uint)((int)((long)iVar29 / (long)outc) >> 0x1f) << 0x20 |
                    (long)iVar29 / (long)outc & 0xffffffffU) / (long)outd;
      outh = (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                  (long)outw);
    }
    if (outd == -1) {
      uVar8 = (long)((ulong)(uint)((int)((long)iVar29 / (long)outc) >> 0x1f) << 0x20 |
                    (long)iVar29 / (long)outc & 0xffffffffU) / (long)outh;
      outd = (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                  (long)outw);
    }
    if (outc == -1) {
      uVar8 = (long)((ulong)(uint)((int)((long)iVar29 / (long)outd) >> 0x1f) << 0x20 |
                    (long)iVar29 / (long)outd & 0xffffffffU) / (long)outh;
      outc = (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                  (long)outw);
    }
  }
  bVar43 = (outc & 3U) == 0 & opt->use_packing_layout;
  local_124 = CONCAT31(local_124._1_3_,bVar43);
  uVar30 = (uint)bVar43 + (uint)bVar43 * 2 + 1;
  sVar41 = uVar40 / uVar36 << bVar43 * '\x02';
  if (((uVar25 - 3 < 2) && (src->c * uVar35 == outc)) && (uVar35 == uVar30)) {
    if (dst != src) {
      piVar4 = src->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = dst->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = dst->data;
          pAVar6 = dst->allocator;
          if (pAVar6 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar6->_vptr_Allocator[3])(pAVar6,pvVar5,uVar40 % uVar36);
          }
        }
      }
      dst->cstep = 0;
      dst->data = (void *)0x0;
      dst->refcount = (int *)0x0;
      *(undefined8 *)((long)&dst->refcount + 4) = 0;
      *(undefined8 *)((long)&dst->elemsize + 4) = 0;
      dst->dims = 0;
      dst->w = 0;
      dst->h = 0;
      dst->d = 0;
      dst->c = 0;
      piVar4 = src->refcount;
      dst->data = src->data;
      dst->refcount = piVar4;
      dst->elemsize = src->elemsize;
      dst->elempack = src->elempack;
      dst->allocator = src->allocator;
      iVar24 = src->w;
      iVar39 = src->h;
      iVar29 = src->d;
      dst->dims = src->dims;
      dst->w = iVar24;
      dst->h = iVar39;
      dst->d = iVar29;
      dst->c = src->c;
      dst->cstep = src->cstep;
    }
    dst->dims = (this->super_Reshape).ndim;
    dst->w = outw;
    dst->h = outh;
    dst->d = outd;
    bVar44 = false;
    iVar24 = 0;
    goto LAB_003527bc;
  }
  local_f8.data = src->data;
  piVar4 = src->refcount;
  local_f8.refcount._0_4_ = SUB84(piVar4,0);
  local_f8.refcount._4_4_ = (undefined4)((ulong)piVar4 >> 0x20);
  local_f8.elemsize._0_4_ = (undefined4)src->elemsize;
  local_f8.elemsize._4_4_ = (undefined4)(src->elemsize >> 0x20);
  local_f8.elempack = src->elempack;
  local_f8.allocator = src->allocator;
  local_f8.dims = src->dims;
  local_f8.w = src->w;
  local_f8.h = src->h;
  local_f8.d = src->d;
  local_f8.c = src->c;
  local_f8.cstep = src->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  opt_flatten.lightmode = opt->lightmode;
  opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
  opt_flatten.use_subgroup_ops = opt->use_subgroup_ops;
  opt_flatten.use_reserved_0 = opt->use_reserved_0;
  opt_flatten.num_threads = opt->num_threads;
  opt_flatten.workspace_allocator = opt->workspace_allocator;
  opt_flatten.openmp_blocktime = opt->openmp_blocktime;
  opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
  opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_flatten.use_int8_inference = opt->use_int8_inference;
  opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
  opt_flatten.use_bf16_storage = opt->use_bf16_storage;
  opt_flatten.use_fp16_packed = opt->use_fp16_packed;
  opt_flatten.use_fp16_storage = opt->use_fp16_storage;
  opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_flatten.use_int8_packed = opt->use_int8_packed;
  opt_flatten.use_int8_storage = opt->use_int8_storage;
  opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_flatten.use_packing_layout = opt->use_packing_layout;
  opt_flatten.vulkan_device_index = opt->vulkan_device_index;
  opt_flatten.use_reserved_1 = opt->use_reserved_1;
  opt_flatten.use_image_storage = opt->use_image_storage;
  opt_flatten.use_tensor_storage = opt->use_tensor_storage;
  opt_flatten.use_reserved_2 = opt->use_reserved_2;
  opt_flatten.flush_denormals = opt->flush_denormals;
  opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
  opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
  opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
  opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
  opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
  opt_flatten.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
  opt_flatten.use_fp16_uniform = opt->use_fp16_uniform;
  opt_flatten.use_int8_uniform = opt->use_int8_uniform;
  opt_flatten.use_reserved_9 = opt->use_reserved_9;
  opt_flatten.use_reserved_10 = opt->use_reserved_10;
  opt_flatten.use_reserved_11 = opt->use_reserved_11;
  opt_flatten.blob_allocator = opt->workspace_allocator;
  local_118 = (Mat *)(ulong)uVar30;
  flatten(src,&local_f8,&opt_flatten);
  if (local_f8.data == (void *)0x0 || (long)local_f8.c * local_f8.cstep == 0) {
    bVar44 = false;
    iVar24 = -100;
  }
  else {
    local_a8 = CONCAT44(local_a8._4_4_,uVar32);
    iVar24 = (int)local_118;
    if ((this->super_Reshape).ndim == 3) {
      Mat::create(dst,outw,outh,outc / iVar24,sVar41,iVar24,opt->blob_allocator);
    }
    else {
      Mat::create(dst,outw,outh,outd,outc / iVar24,sVar41,iVar24,opt->blob_allocator);
    }
    if ((dst->data == (void *)0x0) || ((long)dst->c * dst->cstep == 0)) {
      bVar44 = false;
      iVar24 = -100;
    }
    else {
      uVar25 = dst->h * dst->w * dst->d;
      if ((char)local_124 == '\0') {
LAB_0035260c:
        if (0 < dst->c) {
          lVar31 = 0;
          do {
            puVar26 = (undefined4 *)(dst->cstep * lVar31 * dst->elemsize + (long)dst->data);
            puVar34 = (undefined4 *)(lVar31 * (int)uVar25 * 4 + (long)local_f8.data);
            if ((int)uVar25 < 4) {
              uVar32 = 0;
            }
            else {
              iVar24 = 3;
              do {
                uVar9 = puVar34[1];
                uVar10 = puVar34[2];
                uVar11 = puVar34[3];
                *puVar26 = *puVar34;
                puVar26[1] = uVar9;
                puVar26[2] = uVar10;
                puVar26[3] = uVar11;
                puVar34 = puVar34 + 4;
                puVar26 = puVar26 + 4;
                iVar24 = iVar24 + 4;
                uVar32 = uVar25 & 0xfffffffc;
              } while (iVar24 < (int)uVar25);
            }
            if (uVar25 - uVar32 != 0 && (int)uVar32 <= (int)uVar25) {
              lVar38 = 0;
              do {
                puVar26[lVar38] = puVar34[lVar38];
                lVar38 = lVar38 + 1;
              } while (uVar25 - uVar32 != (int)lVar38);
            }
            lVar31 = lVar31 + 1;
          } while (lVar31 < dst->c);
        }
      }
      else {
        if (0 < dst->c) {
          iVar24 = uVar25 * 4;
          local_118 = (Mat *)CONCAT44(local_118._4_4_,iVar24);
          local_10c = uVar25 & 0xfffffffc;
          local_120 = (ulong)(int)uVar25;
          lVar31 = local_120 * 4;
          lVar33 = local_120 * 0xc;
          local_a0 = local_120 * 0x10;
          lVar38 = local_120 * 8;
          iVar39 = 0;
          lVar42 = 0;
          do {
            sVar41 = dst->cstep;
            pvVar5 = dst->data;
            sVar7 = dst->elemsize;
            puVar26 = (undefined4 *)(sVar41 * lVar42 * sVar7 + (long)pvVar5);
            if ((int)uVar25 < 4) {
              lVar1 = (lVar42 * 4 + 3) * local_120 * 4;
              lVar2 = (lVar42 * 4 + 2) * local_120 * 4;
              lVar3 = (lVar42 * 4 + 1) * local_120 * 4;
              lVar28 = (long)(iVar24 * (int)lVar42) * 4;
              uVar32 = 0;
            }
            else {
              iVar29 = 3;
              lVar28 = 0;
              do {
                puVar27 = puVar26;
                puVar34 = (undefined4 *)((long)local_f8.data + lVar28 + (long)iVar39 * 4);
                uVar9 = puVar34[1];
                uVar10 = puVar34[2];
                uVar11 = puVar34[3];
                puVar26 = (undefined4 *)((long)local_f8.data + lVar28 + lVar31);
                uVar12 = *puVar26;
                uVar13 = puVar26[1];
                uVar14 = puVar26[2];
                uVar15 = puVar26[3];
                puVar26 = (undefined4 *)((long)local_f8.data + lVar28 + lVar38);
                uVar16 = *puVar26;
                uVar17 = puVar26[1];
                uVar18 = puVar26[2];
                uVar19 = puVar26[3];
                puVar26 = (undefined4 *)((long)local_f8.data + lVar28 + lVar33);
                uVar20 = *puVar26;
                uVar21 = puVar26[1];
                uVar22 = puVar26[2];
                uVar23 = puVar26[3];
                puVar26 = (undefined4 *)((long)pvVar5 + lVar28 * 4 + sVar41 * sVar7 * lVar42 + 0x40)
                ;
                puVar26[-0x10] = *puVar34;
                puVar26[-0xf] = uVar12;
                puVar26[-0xe] = uVar16;
                puVar26[-0xd] = uVar20;
                puVar26[-0xc] = uVar9;
                puVar26[-0xb] = uVar13;
                puVar26[-10] = uVar17;
                puVar26[-9] = uVar21;
                puVar26[-8] = uVar10;
                puVar26[-7] = uVar14;
                puVar26[-6] = uVar18;
                puVar26[-5] = uVar22;
                puVar26[-4] = uVar11;
                puVar26[-3] = uVar15;
                puVar26[-2] = uVar19;
                puVar26[-1] = uVar23;
                iVar29 = iVar29 + 4;
                lVar28 = lVar28 + 0x10;
              } while (iVar29 < (int)uVar25);
              puVar26 = puVar27 + 0x10;
              lVar1 = lVar28 + lVar33;
              lVar2 = lVar28 + lVar38;
              lVar3 = lVar28 + lVar31;
              lVar28 = lVar28 + (long)iVar39 * 4;
              uVar32 = local_10c;
            }
            if (uVar25 - uVar32 != 0 && (int)uVar32 <= (int)uVar25) {
              lVar37 = 0;
              do {
                *puVar26 = *(undefined4 *)((long)local_f8.data + lVar37 * 4 + lVar28);
                puVar26[1] = *(undefined4 *)((long)local_f8.data + lVar37 * 4 + lVar3);
                puVar26[2] = *(undefined4 *)((long)local_f8.data + lVar37 * 4 + lVar2);
                puVar26[3] = *(undefined4 *)((long)local_f8.data + lVar37 * 4 + lVar1);
                puVar26 = puVar26 + 4;
                lVar37 = lVar37 + 1;
              } while (uVar25 - uVar32 != (int)lVar37);
            }
            lVar42 = lVar42 + 1;
            lVar33 = lVar33 + local_a0;
            lVar38 = lVar38 + local_a0;
            lVar31 = lVar31 + local_a0;
            iVar39 = iVar39 + iVar24;
            local_90 = dst;
          } while (lVar42 < dst->c);
        }
        if ((char)local_124 == '\0') goto LAB_0035260c;
      }
      bVar44 = true;
      iVar24 = (int)local_a8;
    }
  }
  piVar4 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003527bc:
  if (bVar44) {
    return 0;
  }
  return iVar24;
}

Assistant:

int Reshape_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    Mat& top_blob = top_blobs[0];

    // resolve out shape
    int outw = w;
    int outh = h;
    int outd = d;
    int outc = c;

    if (!shape_expr.empty())
    {
        int er = eval_shape_expr(bottom_blobs, outw, outh, outd, outc);
        if (er != 0)
            return -1;
    }

    if (ndim == 1)
    {
        // flatten
        flatten(bottom_blob, top_blob, opt);
        if (top_blob.empty())
            return -100;

        return 0;
    }

    const int dims = bottom_blob.dims;
    const int elempack = bottom_blob.elempack;
    const size_t elemsize = bottom_blob.elemsize;

    const int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c * elempack;

    if (ndim == 2)
    {
        if (outw == 0)
            outw = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
        if (outh == 0)
            outh = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;

        if (outw == -1)
            outw = total / outh;
        if (outh == -1)
            outh = total / outw;

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 2 && bottom_blob.h * elempack == outh && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            return 0;
        }

        if (out_elempack == 1)
        {
            // flatten
            flatten(bottom_blob, top_blob, opt);
            if (top_blob.empty())
                return -100;

            top_blob.dims = 2;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.cstep = (size_t)outw * outh;
            top_blob.elemsize = out_elemsize;
            top_blob.elempack = out_elempack;

            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < top_blob.h; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 16;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 16 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 16 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 16 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 16 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 16 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 16 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 16 + 7);
                const float* ptr8 = (const float*)bottom_blob_flattened + outw * (i * 16 + 8);
                const float* ptr9 = (const float*)bottom_blob_flattened + outw * (i * 16 + 9);
                const float* ptra = (const float*)bottom_blob_flattened + outw * (i * 16 + 10);
                const float* ptrb = (const float*)bottom_blob_flattened + outw * (i * 16 + 11);
                const float* ptrc = (const float*)bottom_blob_flattened + outw * (i * 16 + 12);
                const float* ptrd = (const float*)bottom_blob_flattened + outw * (i * 16 + 13);
                const float* ptre = (const float*)bottom_blob_flattened + outw * (i * 16 + 14);
                const float* ptrf = (const float*)bottom_blob_flattened + outw * (i * 16 + 15);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 15 < outw; j += 16)
                {
                    __m512 _row0 = _mm512_loadu_ps(ptr0);
                    __m512 _row1 = _mm512_loadu_ps(ptr1);
                    __m512 _row2 = _mm512_loadu_ps(ptr2);
                    __m512 _row3 = _mm512_loadu_ps(ptr3);
                    __m512 _row4 = _mm512_loadu_ps(ptr4);
                    __m512 _row5 = _mm512_loadu_ps(ptr5);
                    __m512 _row6 = _mm512_loadu_ps(ptr6);
                    __m512 _row7 = _mm512_loadu_ps(ptr7);
                    __m512 _row8 = _mm512_loadu_ps(ptr8);
                    __m512 _row9 = _mm512_loadu_ps(ptr9);
                    __m512 _rowa = _mm512_loadu_ps(ptra);
                    __m512 _rowb = _mm512_loadu_ps(ptrb);
                    __m512 _rowc = _mm512_loadu_ps(ptrc);
                    __m512 _rowd = _mm512_loadu_ps(ptrd);
                    __m512 _rowe = _mm512_loadu_ps(ptre);
                    __m512 _rowf = _mm512_loadu_ps(ptrf);

                    transpose16x16_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7, _row8, _row9, _rowa, _rowb, _rowc, _rowd, _rowe, _rowf);

                    _mm512_storeu_ps(outptr, _row0);
                    _mm512_storeu_ps(outptr + 16, _row1);
                    _mm512_storeu_ps(outptr + 16 * 2, _row2);
                    _mm512_storeu_ps(outptr + 16 * 3, _row3);
                    _mm512_storeu_ps(outptr + 16 * 4, _row4);
                    _mm512_storeu_ps(outptr + 16 * 5, _row5);
                    _mm512_storeu_ps(outptr + 16 * 6, _row6);
                    _mm512_storeu_ps(outptr + 16 * 7, _row7);
                    _mm512_storeu_ps(outptr + 16 * 8, _row8);
                    _mm512_storeu_ps(outptr + 16 * 9, _row9);
                    _mm512_storeu_ps(outptr + 16 * 10, _rowa);
                    _mm512_storeu_ps(outptr + 16 * 11, _rowb);
                    _mm512_storeu_ps(outptr + 16 * 12, _rowc);
                    _mm512_storeu_ps(outptr + 16 * 13, _rowd);
                    _mm512_storeu_ps(outptr + 16 * 14, _rowe);
                    _mm512_storeu_ps(outptr + 16 * 15, _rowf);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    ptr3 += 16;
                    ptr4 += 16;
                    ptr5 += 16;
                    ptr6 += 16;
                    ptr7 += 16;
                    ptr8 += 16;
                    ptr9 += 16;
                    ptra += 16;
                    ptrb += 16;
                    ptrc += 16;
                    ptrd += 16;
                    ptre += 16;
                    ptrf += 16;
                    outptr += 256;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;
                    outptr[8] = *ptr8++;
                    outptr[9] = *ptr9++;
                    outptr[10] = *ptra++;
                    outptr[11] = *ptrb++;
                    outptr[12] = *ptrc++;
                    outptr[13] = *ptrd++;
                    outptr[14] = *ptre++;
                    outptr[15] = *ptrf++;

                    outptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < top_blob.h; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 8 + 7);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 7 < outw; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < top_blob.h; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 4 + 3);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (ndim == 3 || ndim == 4)
    {
        if (ndim == 3)
        {
            if (outw == 0)
                outw = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (outh == 0)
                outh = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (outc == 0)
                outc = dims == 3 ? bottom_blob.c * elempack : bottom_blob.c;

            if (outw == -1)
                outw = total / outc / outh;
            if (outh == -1)
                outh = total / outc / outw;
            if (outc == -1)
                outc = total / outh / outw;

            outd = 1;
        }
        else // if (ndim == 4)
        {
            if (outw == 0)
                outw = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (outh == 0)
                outh = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (outd == 0)
                outd = bottom_blob.d;
            if (outc == 0)
                outc = (dims == 3 || dims == 4) ? bottom_blob.c * elempack : bottom_blob.c;

            if (outw == -1)
                outw = total / outc / outd / outh;
            if (outh == -1)
                outh = total / outc / outd / outw;
            if (outd == -1)
                outd = total / outc / outh / outw;
            if (outc == -1)
                outc = total / outd / outh / outw;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if ((dims == 3 || dims == 4) && bottom_blob.c * elempack == outc && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            top_blob.dims = ndim;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.d = outd;
            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        if (ndim == 3)
        {
            top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        else // if (ndim == 4)
        {
            top_blob.create(outw, outh, outd, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        if (top_blob.empty())
            return -100;

        int size = top_blob.w * top_blob.h * top_blob.d;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 16;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 16 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 16 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 16 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 16 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 16 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 16 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 16 + 7);
                const float* ptr8 = (const float*)bottom_blob_flattened + size * (q * 16 + 8);
                const float* ptr9 = (const float*)bottom_blob_flattened + size * (q * 16 + 9);
                const float* ptra = (const float*)bottom_blob_flattened + size * (q * 16 + 10);
                const float* ptrb = (const float*)bottom_blob_flattened + size * (q * 16 + 11);
                const float* ptrc = (const float*)bottom_blob_flattened + size * (q * 16 + 12);
                const float* ptrd = (const float*)bottom_blob_flattened + size * (q * 16 + 13);
                const float* ptre = (const float*)bottom_blob_flattened + size * (q * 16 + 14);
                const float* ptrf = (const float*)bottom_blob_flattened + size * (q * 16 + 15);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 15 < size; i += 16)
                {
                    __m512 _row0 = _mm512_loadu_ps(ptr0);
                    __m512 _row1 = _mm512_loadu_ps(ptr1);
                    __m512 _row2 = _mm512_loadu_ps(ptr2);
                    __m512 _row3 = _mm512_loadu_ps(ptr3);
                    __m512 _row4 = _mm512_loadu_ps(ptr4);
                    __m512 _row5 = _mm512_loadu_ps(ptr5);
                    __m512 _row6 = _mm512_loadu_ps(ptr6);
                    __m512 _row7 = _mm512_loadu_ps(ptr7);
                    __m512 _row8 = _mm512_loadu_ps(ptr8);
                    __m512 _row9 = _mm512_loadu_ps(ptr9);
                    __m512 _rowa = _mm512_loadu_ps(ptra);
                    __m512 _rowb = _mm512_loadu_ps(ptrb);
                    __m512 _rowc = _mm512_loadu_ps(ptrc);
                    __m512 _rowd = _mm512_loadu_ps(ptrd);
                    __m512 _rowe = _mm512_loadu_ps(ptre);
                    __m512 _rowf = _mm512_loadu_ps(ptrf);

                    transpose16x16_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7, _row8, _row9, _rowa, _rowb, _rowc, _rowd, _rowe, _rowf);

                    _mm512_storeu_ps(outptr, _row0);
                    _mm512_storeu_ps(outptr + 16, _row1);
                    _mm512_storeu_ps(outptr + 16 * 2, _row2);
                    _mm512_storeu_ps(outptr + 16 * 3, _row3);
                    _mm512_storeu_ps(outptr + 16 * 4, _row4);
                    _mm512_storeu_ps(outptr + 16 * 5, _row5);
                    _mm512_storeu_ps(outptr + 16 * 6, _row6);
                    _mm512_storeu_ps(outptr + 16 * 7, _row7);
                    _mm512_storeu_ps(outptr + 16 * 8, _row8);
                    _mm512_storeu_ps(outptr + 16 * 9, _row9);
                    _mm512_storeu_ps(outptr + 16 * 10, _rowa);
                    _mm512_storeu_ps(outptr + 16 * 11, _rowb);
                    _mm512_storeu_ps(outptr + 16 * 12, _rowc);
                    _mm512_storeu_ps(outptr + 16 * 13, _rowd);
                    _mm512_storeu_ps(outptr + 16 * 14, _rowe);
                    _mm512_storeu_ps(outptr + 16 * 15, _rowf);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    ptr3 += 16;
                    ptr4 += 16;
                    ptr5 += 16;
                    ptr6 += 16;
                    ptr7 += 16;
                    ptr8 += 16;
                    ptr9 += 16;
                    ptra += 16;
                    ptrb += 16;
                    ptrc += 16;
                    ptrd += 16;
                    ptre += 16;
                    ptrf += 16;
                    outptr += 256;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;
                    outptr[8] = *ptr8++;
                    outptr[9] = *ptr9++;
                    outptr[10] = *ptra++;
                    outptr[11] = *ptrb++;
                    outptr[12] = *ptrc++;
                    outptr[13] = *ptrd++;
                    outptr[14] = *ptre++;
                    outptr[15] = *ptrf++;

                    outptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 8 + 7);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 4 + 3);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr = (const float*)bottom_blob_flattened + size * q;
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i + 3 < size; i += 4)
                {
                    __m128 _v = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(outptr, _v);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}